

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O2

AnalysisState __thiscall HttpData::analysisRequest(HttpData *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string *this_01;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  void *__addr;
  AnalysisState AVar6;
  stat *this_02;
  HttpData *pHVar7;
  string *this_03;
  allocator<char> local_1c1;
  key_type local_1c0;
  undefined1 local_1a0 [32];
  string header;
  string filetype;
  string local_140;
  stat sbuf;
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  
  if ((this->method_ & ~METHOD_POST) != METHOD_GET) {
    return ANALYSIS_ERROR;
  }
  header._M_dataplus._M_p = (pointer)&header.field_2;
  header._M_string_length = 0;
  header.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&header,"HTTP/1.1 200 OK\r\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sbuf,"Connection",(allocator<char> *)local_1a0);
  this_00 = &this->headers_;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)&sbuf);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->headers_)._M_t._M_impl.super__Rb_tree_header) {
    this_02 = &sbuf;
LAB_0010893c:
    std::__cxx11::string::~string((string *)this_02);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filetype,"Connection",(allocator<char> *)&local_140);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&filetype);
    bVar1 = std::operator==(pmVar4,"Keep-Alive");
    if (bVar1) {
      std::__cxx11::string::~string((string *)&filetype);
      std::__cxx11::string::~string((string *)&sbuf);
LAB_00108882:
      this->keepAlive_ = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a0,"Connection: Keep-Alive\r\n",&local_1c1);
      std::operator+(&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     "Keep-Alive: timeout=");
      std::__cxx11::to_string(&local_140,300000);
      std::operator+(&filetype,&local_1c0,&local_140);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sbuf,
                     &filetype,"\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&header,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sbuf)
      ;
      std::__cxx11::string::~string((string *)&sbuf);
      std::__cxx11::string::~string((string *)&filetype);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_1c0);
      this_02 = (stat *)local_1a0;
      goto LAB_0010893c;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"Connection",&local_1c1)
    ;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_1c0);
    bVar1 = std::operator==(pmVar4,"keep-alive");
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&filetype);
    std::__cxx11::string::~string((string *)&sbuf);
    if (bVar1) goto LAB_00108882;
  }
  this_01 = &this->fileName_;
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (this_01,'.',0);
  filetype._M_dataplus._M_p = (pointer)&filetype.field_2;
  filetype._M_string_length = 0;
  filetype.field_2._M_local_buf[0] = '\0';
  if ((int)(uint)sVar5 < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"default",(allocator<char> *)local_1a0);
    MimeType::getMime((string *)&sbuf,&local_1c0);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_1c0,this_01,(ulong)((uint)sVar5 & 0x7fffffff),0xffffffffffffffff);
    MimeType::getMime((string *)&sbuf,&local_1c0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&filetype,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sbuf);
  std::__cxx11::string::~string((string *)&sbuf);
  std::__cxx11::string::~string((string *)&local_1c0);
  bVar1 = std::operator==(this_01,"hello");
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&this->outBuffer_,"HTTP/1.1 200 OK\r\nContent-type: text/plain\r\n\r\nHello World");
  }
  else {
    bVar1 = std::operator==(this_01,"favicon.ico");
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&header,"Content-Type: image/png\r\n");
      std::__cxx11::to_string((string *)local_1a0,0x22b);
      std::operator+(&local_1c0,"Content-Length: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sbuf,
                     &local_1c0,"\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&header,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sbuf)
      ;
      std::__cxx11::string::~string((string *)&sbuf);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&header,"Server: LinYa\'s Web Server\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&header,"\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&this->outBuffer_,&header);
      sbuf.st_dev = (__dev_t)&sbuf.st_nlink;
      std::__cxx11::string::_M_construct<char*>((string *)&sbuf,favicon,&DAT_0011951b);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&this->outBuffer_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sbuf);
      std::__cxx11::string::~string((string *)&sbuf);
    }
    else {
      iVar2 = stat((this_01->_M_dataplus)._M_p,(stat *)&sbuf);
      if (iVar2 < 0) {
        header._M_string_length = 0;
        *header._M_dataplus._M_p = '\0';
        iVar2 = this->fd_;
        pHVar7 = (HttpData *)&stack0xffffffffffffffb0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)pHVar7,"Not Found!",(allocator<char> *)&local_1c0);
        handleError(pHVar7,iVar2,0x194,(string *)&stack0xffffffffffffffb0);
        this_03 = (string *)&stack0xffffffffffffffb0;
LAB_00108d7b:
        std::__cxx11::string::~string(this_03);
        AVar6 = ANALYSIS_ERROR;
        goto LAB_00108cc7;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     "Content-Type: ",&filetype);
      std::operator+(&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     "\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&header,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::to_string(&local_140,sbuf.st_size);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     "Content-Length: ",&local_140);
      std::operator+(&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     "\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&header,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&header,"Server: LinYa\'s Web Server\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&header,"\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&this->outBuffer_,&header);
      if (this->method_ != METHOD_HEAD) {
        iVar2 = open((this_01->_M_dataplus)._M_p,0,0);
        if (iVar2 < 0) {
          (this->outBuffer_)._M_string_length = 0;
          *(this->outBuffer_)._M_dataplus._M_p = '\0';
          iVar2 = this->fd_;
          pHVar7 = (HttpData *)local_70;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pHVar7,"Not Found!",(allocator<char> *)&local_1c0);
          handleError(pHVar7,iVar2,0x194,(string *)local_70);
          this_03 = (string *)local_70;
          goto LAB_00108d7b;
        }
        AVar6 = ANALYSIS_ERROR;
        __addr = mmap((void *)0x0,sbuf.st_size,1,2,iVar2,0);
        close(iVar2);
        if (__addr == (void *)0xffffffffffffffff) {
          munmap((void *)0xffffffffffffffff,sbuf.st_size);
          (this->outBuffer_)._M_string_length = 0;
          *(this->outBuffer_)._M_dataplus._M_p = '\0';
          iVar2 = this->fd_;
          pHVar7 = (HttpData *)local_90;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pHVar7,"Not Found!",(allocator<char> *)&local_1c0);
          handleError(pHVar7,iVar2,0x194,(string *)local_90);
          std::__cxx11::string::~string((string *)local_90);
          goto LAB_00108cc7;
        }
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c0,__addr,(long)__addr + sbuf.st_size);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&this->outBuffer_,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        munmap(__addr,sbuf.st_size);
      }
    }
  }
  AVar6 = ANALYSIS_SUCCESS;
LAB_00108cc7:
  std::__cxx11::string::~string((string *)&filetype);
  std::__cxx11::string::~string((string *)&header);
  return AVar6;
}

Assistant:

AnalysisState HttpData::analysisRequest() {
  if (method_ == METHOD_POST) {
    // ------------------------------------------------------
    // My CV stitching handler which requires OpenCV library
    // ------------------------------------------------------
    // string header;
    // header += string("HTTP/1.1 200 OK\r\n");
    // if(headers_.find("Connection") != headers_.end() &&
    // headers_["Connection"] == "Keep-Alive")
    // {
    //     keepAlive_ = true;
    //     header += string("Connection: Keep-Alive\r\n") + "Keep-Alive:
    //     timeout=" + to_string(DEFAULT_KEEP_ALIVE_TIME) + "\r\n";
    // }
    // int length = stoi(headers_["Content-length"]);
    // vector<char> data(inBuffer_.begin(), inBuffer_.begin() + length);
    // Mat src = imdecode(data, CV_LOAD_IMAGE_ANYDEPTH|CV_LOAD_IMAGE_ANYCOLOR);
    // //imwrite("receive.bmp", src);
    // Mat res = stitch(src);
    // vector<uchar> data_encode;
    // imencode(".png", res, data_encode);
    // header += string("Content-length: ") + to_string(data_encode.size()) +
    // "\r\n\r\n";
    // outBuffer_ += header + string(data_encode.begin(), data_encode.end());
    // inBuffer_ = inBuffer_.substr(length);
    // return ANALYSIS_SUCCESS;
  } else if (method_ == METHOD_GET || method_ == METHOD_HEAD) {
    string header;
    header += "HTTP/1.1 200 OK\r\n";
    if (headers_.find("Connection") != headers_.end() &&
        (headers_["Connection"] == "Keep-Alive" ||
         headers_["Connection"] == "keep-alive")) {
      keepAlive_ = true;
      header += string("Connection: Keep-Alive\r\n") + "Keep-Alive: timeout=" +
                to_string(DEFAULT_KEEP_ALIVE_TIME) + "\r\n";
    }
    int dot_pos = fileName_.find('.');
    string filetype;
    if (dot_pos < 0)
      filetype = MimeType::getMime("default");
    else
      filetype = MimeType::getMime(fileName_.substr(dot_pos));

    // echo test
    if (fileName_ == "hello") {
      outBuffer_ =
          "HTTP/1.1 200 OK\r\nContent-type: text/plain\r\n\r\nHello World";
      return ANALYSIS_SUCCESS;
    }
    if (fileName_ == "favicon.ico") {
      header += "Content-Type: image/png\r\n";
      header += "Content-Length: " + to_string(sizeof favicon) + "\r\n";
      header += "Server: LinYa's Web Server\r\n";

      header += "\r\n";
      outBuffer_ += header;
      outBuffer_ += string(favicon, favicon + sizeof favicon);
      ;
      return ANALYSIS_SUCCESS;
    }

    struct stat sbuf;
    if (stat(fileName_.c_str(), &sbuf) < 0) {
      header.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    header += "Content-Type: " + filetype + "\r\n";
    header += "Content-Length: " + to_string(sbuf.st_size) + "\r\n";
    header += "Server: LinYa's Web Server\r\n";
    // 头部结束
    header += "\r\n";
    outBuffer_ += header;

    if (method_ == METHOD_HEAD) return ANALYSIS_SUCCESS;

    int src_fd = open(fileName_.c_str(), O_RDONLY, 0);
    if (src_fd < 0) {
      outBuffer_.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    void *mmapRet = mmap(NULL, sbuf.st_size, PROT_READ, MAP_PRIVATE, src_fd, 0);
    close(src_fd);
    if (mmapRet == (void *)-1) {
      munmap(mmapRet, sbuf.st_size);
      outBuffer_.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    char *src_addr = static_cast<char *>(mmapRet);
    outBuffer_ += string(src_addr, src_addr + sbuf.st_size);
    ;
    munmap(mmapRet, sbuf.st_size);
    return ANALYSIS_SUCCESS;
  }
  return ANALYSIS_ERROR;
}